

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

aiMetadata * aiMetadata::Alloc(uint numProperties)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  aiString *paVar3;
  ulong uVar4;
  aiMetadataEntry *__s;
  aiString *local_40;
  aiMetadata *data;
  aiMetadata *paStack_10;
  uint numProperties_local;
  
  if (numProperties == 0) {
    paStack_10 = (aiMetadata *)0x0;
  }
  else {
    paStack_10 = (aiMetadata *)operator_new(0x18);
    aiMetadata(paStack_10);
    paStack_10->mNumProperties = numProperties;
    uVar4 = CONCAT44(0,paStack_10->mNumProperties);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar2 = SUB168(auVar1 * ZEXT816(0x404),0);
    if (SUB168(auVar1 * ZEXT816(0x404),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    paVar3 = (aiString *)operator_new__(uVar2);
    if (uVar4 != 0) {
      local_40 = paVar3;
      do {
        aiString::aiString(local_40);
        local_40 = local_40 + 1;
      } while (local_40 != paVar3 + uVar4);
    }
    paStack_10->mKeys = paVar3;
    auVar1 = ZEXT416(paStack_10->mNumProperties) * ZEXT816(0x10);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    __s = (aiMetadataEntry *)operator_new__(uVar4);
    memset(__s,0,uVar4);
    paStack_10->mValues = __s;
  }
  return paStack_10;
}

Assistant:

static inline
    aiMetadata *Alloc( unsigned int numProperties ) {
        if ( 0 == numProperties ) {
            return nullptr;
        }

        aiMetadata *data = new aiMetadata;
        data->mNumProperties = numProperties;
        data->mKeys = new aiString[ data->mNumProperties ]();
        data->mValues = new aiMetadataEntry[ data->mNumProperties ]();

        return data;
    }